

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O2

SC_Cell * Abc_SclFindInvertor(SC_Lib *p,int fFindBuff)

{
  void *pvVar1;
  void *pvVar2;
  SC_Cell *pSVar3;
  int i;
  long lVar4;
  
  lVar4 = -0x5555555555555556;
  if (fFindBuff == 0) {
    lVar4 = 0x5555555555555555;
  }
  pvVar1 = (void *)0x0;
  for (i = 0; i < (p->vCellClasses).nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(&p->vCellClasses,i);
    if (*(int *)((long)pvVar1 + 0x40) == 1) {
      pvVar2 = Vec_PtrEntry((Vec_Ptr_t *)((long)pvVar1 + 0x30),1);
      if (*(int *)((long)pvVar2 + 0x34) < 1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      if (**(long **)((long)pvVar2 + 0x38) == lVar4) goto LAB_003bcffc;
    }
  }
  if (pvVar1 == (void *)0x0) {
    pSVar3 = (SC_Cell *)0x0;
  }
  else {
LAB_003bcffc:
    pSVar3 = *(SC_Cell **)((long)pvVar1 + 0x58);
  }
  return pSVar3;
}

Assistant:

SC_Cell * Abc_SclFindInvertor( SC_Lib * p, int fFindBuff )
{
    SC_Cell * pCell = NULL;
    word Truth = fFindBuff ? ABC_CONST(0xAAAAAAAAAAAAAAAA) : ABC_CONST(0x5555555555555555);
    int k;
    SC_LibForEachCellClass( p, pCell, k )
        if ( pCell->n_inputs == 1 && Vec_WrdEntry(&SC_CellPin(pCell, 1)->vFunc, 0) == Truth )
            break;
    // take representative
    return pCell ? pCell->pRepr : NULL;
}